

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICallReader.cpp
# Opt level: O2

void __thiscall ICallReader::getWord(ICallReader *this,string *str)

{
  char ch;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  char cVar4;
  
  while( true ) {
    ch = std::istream::get();
    cVar4 = (char)str;
    if ((ch == -1) || (bVar1 = IDictionary::isLetterOrNumberOrDL(ch), !bVar1)) break;
    std::__cxx11::string::push_back(cVar4);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&IDictionary::fun_abi_cxx11_._M_t,str);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &IDictionary::fun_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign((string *)&this->m_funName);
    do {
      bVar1 = IDictionary::isBlankSep(ch);
      if (!bVar1) break;
      std::__cxx11::string::push_back(cVar4);
      if (ch == '\n') {
        std::__cxx11::string::push_back(cVar4);
      }
      ch = std::istream::get();
    } while (ch != -1);
    if (ch == '(') {
      std::__cxx11::string::push_back(cVar4);
      do {
        iVar2 = std::istream::get();
        if (iVar2 << 0x18 == -0x1000000) {
          return;
        }
        std::__cxx11::string::push_back(cVar4);
      } while (iVar2 << 0x18 != 0x29000000);
      return;
    }
  }
  std::__cxx11::string::assign((char *)str);
  return;
}

Assistant:

void ICallReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar=m_ifs->get())!=EOF)
    {
        if(!IDictionary::isLetterOrNumberOrDL(tempChar))
            break;
        str+=tempChar;
    }
    if(IDictionary::fun.find(str)==IDictionary::fun.end())
    {
        str="";
        return;
    }
    else
        m_funName=str;
    do
    {
        if(IDictionary::isBlankSep(tempChar))
        {
            str+=tempChar;
            if(tempChar=='\n')
                str+='\n';
        }
        else
            break;
    }while((tempChar=m_ifs->get())!=EOF);

    if(tempChar=='(')
        str+=tempChar;
    else
    {
        str="";
        return;
    }

    while((tempChar=m_ifs->get())!=EOF)
    {
        str+=tempChar;
        if(tempChar==')')
            break;
    }
}